

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_rewrite_module.c
# Opt level: O0

char * ngx_http_rewrite_merge_loc_conf(ngx_conf_t *cf,void *parent,void *child)

{
  undefined8 *puVar1;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  uintptr_t *code;
  ngx_http_rewrite_loc_conf_t *conf;
  ngx_http_rewrite_loc_conf_t *prev;
  void *child_local;
  void *parent_local;
  ngx_conf_t *cf_local;
  
  if (*(long *)((long)child + 0x10) == -1) {
    if (*(long *)((long)parent + 0x10) == -1) {
      local_48 = 0;
    }
    else {
      local_48 = *(undefined8 *)((long)parent + 0x10);
    }
    *(undefined8 *)((long)child + 0x10) = local_48;
  }
  if (*(long *)((long)child + 0x18) == -1) {
    if (*(long *)((long)parent + 0x18) == -1) {
      local_50 = 1;
    }
    else {
      local_50 = *(undefined8 *)((long)parent + 0x18);
    }
    *(undefined8 *)((long)child + 0x18) = local_50;
  }
  if (*(long *)((long)child + 8) == -1) {
    if (*(long *)((long)parent + 8) == -1) {
      local_58 = 10;
    }
    else {
      local_58 = *(undefined8 *)((long)parent + 8);
    }
    *(undefined8 *)((long)child + 8) = local_58;
  }
  if (*child == 0) {
    cf_local = (ngx_conf_t *)0x0;
  }
  else if (*child == *parent) {
    cf_local = (ngx_conf_t *)0x0;
  }
  else {
    puVar1 = (undefined8 *)ngx_array_push_n(*child,8);
    if (puVar1 == (undefined8 *)0x0) {
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else {
      *puVar1 = 0;
      cf_local = (ngx_conf_t *)0x0;
    }
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_rewrite_merge_loc_conf(ngx_conf_t *cf, void *parent, void *child)
{
    ngx_http_rewrite_loc_conf_t *prev = parent;
    ngx_http_rewrite_loc_conf_t *conf = child;

    uintptr_t  *code;

    ngx_conf_merge_value(conf->log, prev->log, 0);
    ngx_conf_merge_value(conf->uninitialized_variable_warn,
                         prev->uninitialized_variable_warn, 1);
    ngx_conf_merge_uint_value(conf->stack_size, prev->stack_size, 10);

    if (conf->codes == NULL) {
        return NGX_CONF_OK;
    }

    if (conf->codes == prev->codes) {
        return NGX_CONF_OK;
    }

    code = ngx_array_push_n(conf->codes, sizeof(uintptr_t));
    if (code == NULL) {
        return NGX_CONF_ERROR;
    }

    *code = (uintptr_t) NULL;

    return NGX_CONF_OK;
}